

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  NodeRef *pNVar18;
  size_t sVar19;
  ulong uVar20;
  byte bVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar41 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint uVar48;
  uint uVar49;
  uint uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  NodeRef *local_14d0;
  undefined1 local_1498 [16];
  long local_1488;
  long local_1480;
  ulong local_1478;
  Scene *local_1470;
  RTCFilterFunctionNArguments args;
  float local_13c8 [4];
  undefined1 local_13b8 [16];
  float local_13a8 [4];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  RTCHitN local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  uint local_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  uint uStack_12e0;
  uint uStack_12dc;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  stack[0] = root;
  auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar52 = ZEXT3264(auVar37);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar53 = ZEXT3264(auVar38);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar54 = ZEXT3264(auVar39);
  auVar23 = vmulss_avx512f(auVar37._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar24 = vmulss_avx512f(auVar38._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar37._0_4_ = auVar23._0_4_;
  auVar37._4_4_ = auVar37._0_4_;
  auVar37._8_4_ = auVar37._0_4_;
  auVar37._12_4_ = auVar37._0_4_;
  auVar37._16_4_ = auVar37._0_4_;
  auVar37._20_4_ = auVar37._0_4_;
  auVar37._24_4_ = auVar37._0_4_;
  auVar37._28_4_ = auVar37._0_4_;
  auVar38._0_4_ = auVar24._0_4_;
  auVar38._4_4_ = auVar38._0_4_;
  auVar38._8_4_ = auVar38._0_4_;
  auVar38._12_4_ = auVar38._0_4_;
  auVar38._16_4_ = auVar38._0_4_;
  auVar38._20_4_ = auVar38._0_4_;
  auVar38._24_4_ = auVar38._0_4_;
  auVar38._28_4_ = auVar38._0_4_;
  auVar23 = vmulss_avx512f(auVar39._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar39._0_4_ = auVar23._0_4_;
  auVar39._4_4_ = auVar39._0_4_;
  auVar39._8_4_ = auVar39._0_4_;
  auVar39._12_4_ = auVar39._0_4_;
  auVar39._16_4_ = auVar39._0_4_;
  auVar39._20_4_ = auVar39._0_4_;
  auVar39._24_4_ = auVar39._0_4_;
  auVar39._28_4_ = auVar39._0_4_;
  local_1478 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar15 = local_1478 ^ 0x20;
  auVar41._8_4_ = 0x80000000;
  auVar41._0_8_ = 0x8000000080000000;
  auVar41._12_4_ = 0x80000000;
  auVar41._16_4_ = 0x80000000;
  auVar41._20_4_ = 0x80000000;
  auVar41._24_4_ = 0x80000000;
  auVar41._28_4_ = 0x80000000;
  auVar37 = vxorps_avx512vl(auVar37,auVar41);
  auVar55 = ZEXT3264(auVar37);
  auVar37 = vxorps_avx512vl(auVar38,auVar41);
  auVar56 = ZEXT3264(auVar37);
  auVar37 = vxorps_avx512vl(auVar39,auVar41);
  auVar57 = ZEXT3264(auVar37);
  auVar37 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar58 = ZEXT3264(auVar37);
  auVar37 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar59 = ZEXT3264(auVar37);
  auVar23 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar60 = ZEXT1664(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar61 = ZEXT1664(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar62 = ZEXT1664(auVar23);
  auVar23 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar63 = ZEXT1664(auVar23);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar64 = ZEXT1664(auVar23);
  local_14d0 = stack + 1;
LAB_01d8e147:
  do {
    pNVar18 = local_14d0;
    if (pNVar18 == stack) {
LAB_01d8e80d:
      return pNVar18 != stack;
    }
    local_14d0 = pNVar18 + -1;
    sVar19 = pNVar18[-1].ptr;
    while ((sVar19 & 8) == 0) {
      auVar37 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar19 + 0x40 + local_1478),auVar55._0_32_,
                           auVar52._0_32_);
      auVar38 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar19 + 0x40 + uVar14),auVar56._0_32_,
                           auVar53._0_32_);
      auVar37 = vpmaxsd_avx2(auVar37,auVar38);
      auVar38 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar19 + 0x40 + uVar20),auVar57._0_32_,
                           auVar54._0_32_);
      auVar38 = vpmaxsd_avx512vl(auVar38,auVar58._0_32_);
      auVar37 = vpmaxsd_avx2(auVar37,auVar38);
      auVar38 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar19 + 0x40 + uVar15),auVar55._0_32_,
                           auVar52._0_32_);
      auVar39 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar19 + 0x40 + (uVar14 ^ 0x20)),auVar56._0_32_,
                           auVar53._0_32_);
      auVar38 = vpminsd_avx2(auVar38,auVar39);
      auVar39 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar19 + 0x40 + (uVar20 ^ 0x20)),auVar57._0_32_,
                           auVar54._0_32_);
      auVar39 = vpminsd_avx512vl(auVar39,auVar59._0_32_);
      auVar38 = vpminsd_avx2(auVar38,auVar39);
      uVar17 = vpcmpd_avx512vl(auVar37,auVar38,2);
      if ((char)uVar17 == '\0') goto LAB_01d8e147;
      uVar11 = sVar19 & 0xfffffffffffffff0;
      lVar13 = 0;
      for (uVar12 = uVar17; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
        lVar13 = lVar13 + 1;
      }
      sVar19 = *(size_t *)(uVar11 + lVar13 * 8);
      uVar16 = (uint)uVar17 - 1 & (uint)uVar17;
      uVar17 = (ulong)uVar16;
      if (uVar16 != 0) {
        do {
          local_14d0->ptr = sVar19;
          local_14d0 = local_14d0 + 1;
          lVar13 = 0;
          for (uVar12 = uVar17; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
            lVar13 = lVar13 + 1;
          }
          uVar17 = uVar17 - 1 & uVar17;
          sVar19 = *(size_t *)(uVar11 + lVar13 * 8);
        } while (uVar17 != 0);
      }
    }
    local_1480 = (ulong)((uint)sVar19 & 0xf) - 8;
    uVar17 = sVar19 & 0xfffffffffffffff0;
    for (local_1488 = 0; local_1488 != local_1480; local_1488 = local_1488 + 1) {
      lVar13 = local_1488 * 0xb0;
      auVar23 = *(undefined1 (*) [16])(uVar17 + 0x80 + lVar13);
      auVar24 = *(undefined1 (*) [16])(uVar17 + 0x40 + lVar13);
      auVar35 = *(undefined1 (*) [16])(uVar17 + 0x70 + lVar13);
      auVar34 = *(undefined1 (*) [16])(uVar17 + 0x50 + lVar13);
      auVar25._0_4_ = auVar24._0_4_ * auVar23._0_4_;
      auVar25._4_4_ = auVar24._4_4_ * auVar23._4_4_;
      auVar25._8_4_ = auVar24._8_4_ * auVar23._8_4_;
      auVar25._12_4_ = auVar24._12_4_ * auVar23._12_4_;
      auVar45 = *(undefined1 (*) [16])(uVar17 + 0x60 + lVar13);
      auVar46 = *(undefined1 (*) [16])(uVar17 + 0x30 + lVar13);
      local_1398 = vfmsub231ps_fma(auVar25,auVar35,auVar34);
      auVar29._0_4_ = auVar34._0_4_ * auVar45._0_4_;
      auVar29._4_4_ = auVar34._4_4_ * auVar45._4_4_;
      auVar29._8_4_ = auVar34._8_4_ * auVar45._8_4_;
      auVar29._12_4_ = auVar34._12_4_ * auVar45._12_4_;
      local_1388 = vfmsub231ps_fma(auVar29,auVar23,auVar46);
      auVar30._0_4_ = auVar46._0_4_ * auVar35._0_4_;
      auVar30._4_4_ = auVar46._4_4_ * auVar35._4_4_;
      auVar30._8_4_ = auVar46._8_4_ * auVar35._8_4_;
      auVar30._12_4_ = auVar46._12_4_ * auVar35._12_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar32._4_4_ = uVar1;
      auVar32._0_4_ = uVar1;
      auVar32._8_4_ = uVar1;
      auVar32._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar33._4_4_ = uVar1;
      auVar33._0_4_ = uVar1;
      auVar33._8_4_ = uVar1;
      auVar33._12_4_ = uVar1;
      fVar2 = *(float *)(ray + k * 4 + 0x60);
      auVar31._4_4_ = fVar2;
      auVar31._0_4_ = fVar2;
      auVar31._8_4_ = fVar2;
      auVar31._12_4_ = fVar2;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar28._4_4_ = uVar1;
      auVar28._0_4_ = uVar1;
      auVar28._8_4_ = uVar1;
      auVar28._12_4_ = uVar1;
      auVar25 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar17 + lVar13),auVar28);
      local_1378 = vfmsub231ps_fma(auVar30,auVar45,auVar24);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar26._4_4_ = uVar1;
      auVar26._0_4_ = uVar1;
      auVar26._8_4_ = uVar1;
      auVar26._12_4_ = uVar1;
      auVar26 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar17 + 0x10 + lVar13),auVar26);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar27._4_4_ = uVar1;
      auVar27._0_4_ = uVar1;
      auVar27._8_4_ = uVar1;
      auVar27._12_4_ = uVar1;
      auVar27 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar17 + 0x20 + lVar13),auVar27);
      auVar28 = vmulps_avx512vl(auVar33,auVar27);
      auVar29 = vfmsub231ps_avx512vl(auVar28,auVar26,auVar31);
      auVar28 = vmulps_avx512vl(auVar31,auVar25);
      auVar30 = vfmsub231ps_avx512vl(auVar28,auVar27,auVar32);
      auVar28 = vmulps_avx512vl(auVar32,auVar26);
      auVar31 = vfmsub231ps_avx512vl(auVar28,auVar25,auVar33);
      auVar51._0_4_ = fVar2 * local_1378._0_4_;
      auVar51._4_4_ = fVar2 * local_1378._4_4_;
      auVar51._8_4_ = fVar2 * local_1378._8_4_;
      auVar51._12_4_ = fVar2 * local_1378._12_4_;
      auVar28 = vfmadd231ps_fma(auVar51,local_1388,auVar33);
      auVar28 = vfmadd231ps_fma(auVar28,local_1398,auVar32);
      auVar32 = vandps_avx512vl(auVar28,auVar61._0_16_);
      auVar33 = vandps_avx512vl(auVar28,auVar62._0_16_);
      auVar23 = vmulps_avx512vl(auVar23,auVar31);
      auVar23 = vfmadd231ps_avx512vl(auVar23,auVar30,auVar35);
      auVar23 = vfmadd231ps_avx512vl(auVar23,auVar29,auVar45);
      uVar16 = auVar33._0_4_;
      auVar35._0_4_ = (float)(uVar16 ^ auVar23._0_4_);
      uVar48 = auVar33._4_4_;
      auVar35._4_4_ = (float)(uVar48 ^ auVar23._4_4_);
      uVar49 = auVar33._8_4_;
      auVar35._8_4_ = (float)(uVar49 ^ auVar23._8_4_);
      uVar50 = auVar33._12_4_;
      auVar35._12_4_ = (float)(uVar50 ^ auVar23._12_4_);
      auVar23 = vmulps_avx512vl(auVar34,auVar31);
      auVar23 = vfmadd231ps_avx512vl(auVar23,auVar24,auVar30);
      auVar23 = vfmadd231ps_avx512vl(auVar23,auVar46,auVar29);
      auVar24._0_4_ = (float)(uVar16 ^ auVar23._0_4_);
      auVar24._4_4_ = (float)(uVar48 ^ auVar23._4_4_);
      auVar24._8_4_ = (float)(uVar49 ^ auVar23._8_4_);
      auVar24._12_4_ = (float)(uVar50 ^ auVar23._12_4_);
      auVar23 = auVar63._0_16_;
      uVar7 = vcmpps_avx512vl(auVar35,auVar23,5);
      uVar8 = vcmpps_avx512vl(auVar24,auVar23,5);
      uVar9 = vcmpps_avx512vl(auVar28,auVar23,4);
      auVar23._0_4_ = auVar35._0_4_ + auVar24._0_4_;
      auVar23._4_4_ = auVar35._4_4_ + auVar24._4_4_;
      auVar23._8_4_ = auVar35._8_4_ + auVar24._8_4_;
      auVar23._12_4_ = auVar35._12_4_ + auVar24._12_4_;
      uVar10 = vcmpps_avx512vl(auVar23,auVar32,2);
      bVar21 = (byte)uVar7 & (byte)uVar8 & (byte)uVar9 & (byte)uVar10;
      if (bVar21 != 0) {
        auVar46._0_4_ = auVar27._0_4_ * local_1378._0_4_;
        auVar46._4_4_ = auVar27._4_4_ * local_1378._4_4_;
        auVar46._8_4_ = auVar27._8_4_ * local_1378._8_4_;
        auVar46._12_4_ = auVar27._12_4_ * local_1378._12_4_;
        auVar23 = vfmadd213ps_fma(auVar26,local_1388,auVar46);
        auVar23 = vfmadd213ps_fma(auVar25,local_1398,auVar23);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar34._4_4_ = uVar1;
        auVar34._0_4_ = uVar1;
        auVar34._8_4_ = uVar1;
        auVar34._12_4_ = uVar1;
        auVar34 = vmulps_avx512vl(auVar32,auVar34);
        fVar2 = *(float *)(ray + k * 4 + 0x80);
        auVar45._0_4_ = (float)(uVar16 ^ auVar23._0_4_);
        auVar45._4_4_ = (float)(uVar48 ^ auVar23._4_4_);
        auVar45._8_4_ = (float)(uVar49 ^ auVar23._8_4_);
        auVar45._12_4_ = (float)(uVar50 ^ auVar23._12_4_);
        auVar47._0_4_ = fVar2 * auVar32._0_4_;
        auVar47._4_4_ = fVar2 * auVar32._4_4_;
        auVar47._8_4_ = fVar2 * auVar32._8_4_;
        auVar47._12_4_ = fVar2 * auVar32._12_4_;
        uVar7 = vcmpps_avx512vl(auVar45,auVar47,2);
        uVar8 = vcmpps_avx512vl(auVar34,auVar45,1);
        bVar21 = (byte)uVar7 & (byte)uVar8 & bVar21;
        if (bVar21 != 0) {
          local_1470 = context->scene;
          auVar23 = vrcp14ps_avx512vl(auVar32);
          auVar34 = vfnmadd213ps_avx512vl(auVar32,auVar23,auVar64._0_16_);
          auVar23 = vfmadd132ps_fma(auVar34,auVar23,auVar23);
          fVar40 = auVar23._0_4_;
          fVar42 = auVar23._4_4_;
          fVar43 = auVar23._8_4_;
          fVar44 = auVar23._12_4_;
          local_13a8[0] = fVar40 * auVar45._0_4_;
          local_13a8[1] = fVar42 * auVar45._4_4_;
          local_13a8[2] = fVar43 * auVar45._8_4_;
          local_13a8[3] = fVar44 * auVar45._12_4_;
          local_13c8[0] = fVar40 * auVar35._0_4_;
          local_13c8[1] = fVar42 * auVar35._4_4_;
          local_13c8[2] = fVar43 * auVar35._8_4_;
          local_13c8[3] = fVar44 * auVar35._12_4_;
          local_13b8._0_4_ = fVar40 * auVar24._0_4_;
          local_13b8._4_4_ = fVar42 * auVar24._4_4_;
          local_13b8._8_4_ = fVar43 * auVar24._8_4_;
          local_13b8._12_4_ = fVar44 * auVar24._12_4_;
          uVar12 = (ulong)bVar21;
          do {
            auVar23 = auVar63._0_16_;
            uVar11 = 0;
            for (uVar22 = uVar12; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              uVar11 = uVar11 + 1;
            }
            pGVar4 = (local_1470->geometries).items[*(uint *)(lVar13 + uVar17 + 0x90 + uVar11 * 4)].
                     ptr;
            if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01d8e801:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_01d8e80d;
              }
              local_12d8 = vmovdqu64_avx512vl(auVar59._0_32_);
              local_12b8 = vmovdqu64_avx512vl(auVar58._0_32_);
              local_1298 = auVar57._0_32_;
              local_1278 = auVar56._0_32_;
              local_1258 = auVar55._0_32_;
              local_1238 = auVar54._0_32_;
              local_1218 = auVar53._0_32_;
              local_11f8 = auVar52._0_32_;
              uVar22 = (ulong)(uint)((int)uVar11 * 4);
              uVar1 = *(undefined4 *)((long)local_13c8 + uVar22);
              local_1338._4_4_ = uVar1;
              local_1338._0_4_ = uVar1;
              local_1338._8_4_ = uVar1;
              local_1338._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(local_13b8 + uVar22);
              local_1328._4_4_ = uVar1;
              local_1328._0_4_ = uVar1;
              local_1328._8_4_ = uVar1;
              local_1328._12_4_ = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_13a8 + uVar22);
              args.context = context->user;
              local_1308 = vpbroadcastd_avx512vl();
              uVar1 = *(undefined4 *)(lVar13 + uVar17 + 0xa0 + uVar22);
              local_1318._4_4_ = uVar1;
              local_1318._0_4_ = uVar1;
              local_1318._8_4_ = uVar1;
              local_1318._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(local_1398 + uVar22);
              uVar3 = *(undefined4 *)(local_1388 + uVar22);
              local_1358._4_4_ = uVar3;
              local_1358._0_4_ = uVar3;
              local_1358._8_4_ = uVar3;
              local_1358._12_4_ = uVar3;
              uVar3 = *(undefined4 *)(local_1378 + uVar22);
              local_1348._4_4_ = uVar3;
              local_1348._0_4_ = uVar3;
              local_1348._8_4_ = uVar3;
              local_1348._12_4_ = uVar3;
              local_1368[0] = (RTCHitN)(char)uVar1;
              local_1368[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1368[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1368[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_1368[4] = (RTCHitN)(char)uVar1;
              local_1368[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1368[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1368[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_1368[8] = (RTCHitN)(char)uVar1;
              local_1368[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1368[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1368[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              local_1368[0xc] = (RTCHitN)(char)uVar1;
              local_1368[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
              local_1368[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
              local_1368[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
              vpcmpeqd_avx2(ZEXT1632(local_1308),ZEXT1632(local_1308));
              uStack_12f4 = (args.context)->instID[0];
              local_12f8 = uStack_12f4;
              uStack_12f0 = uStack_12f4;
              uStack_12ec = uStack_12f4;
              uStack_12e8 = (args.context)->instPrimID[0];
              uStack_12e4 = uStack_12e8;
              uStack_12e0 = uStack_12e8;
              uStack_12dc = uStack_12e8;
              auVar35 = auVar60._0_16_;
              local_1498 = vmovdqa64_avx512vl(auVar35);
              args.valid = (int *)local_1498;
              args.geometryUserPtr = pGVar4->userPtr;
              args.hit = local_1368;
              args.N = 4;
              auVar24 = vmovdqa64_avx512vl(auVar35);
              auVar35 = vmovdqa64_avx512vl(auVar35);
              args.ray = (RTCRayN *)ray;
              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->occlusionFilterN)(&args);
                auVar35 = local_1498;
              }
              uVar22 = vptestmd_avx512vl(auVar35,auVar35);
              if ((uVar22 & 0xf) != 0) {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var5)(&args);
                  auVar35 = local_1498;
                }
                uVar22 = vptestmd_avx512vl(auVar35,auVar35);
                uVar22 = uVar22 & 0xf;
                auVar35 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar6 = (bool)((byte)uVar22 & 1);
                auVar36._0_4_ =
                     (uint)bVar6 * auVar35._0_4_ | (uint)!bVar6 * *(int *)(args.ray + 0x80);
                bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
                auVar36._4_4_ =
                     (uint)bVar6 * auVar35._4_4_ | (uint)!bVar6 * *(int *)(args.ray + 0x84);
                bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
                auVar36._8_4_ =
                     (uint)bVar6 * auVar35._8_4_ | (uint)!bVar6 * *(int *)(args.ray + 0x88);
                bVar6 = SUB81(uVar22 >> 3,0);
                auVar36._12_4_ =
                     (uint)bVar6 * auVar35._12_4_ | (uint)!bVar6 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar36;
                if ((byte)uVar22 != 0) goto LAB_01d8e801;
              }
              *(float *)(ray + k * 4 + 0x80) = fVar2;
              auVar52 = ZEXT3264(local_11f8);
              auVar53 = ZEXT3264(local_1218);
              auVar54 = ZEXT3264(local_1238);
              auVar55 = ZEXT3264(local_1258);
              auVar56 = ZEXT3264(local_1278);
              auVar57 = ZEXT3264(local_1298);
              auVar37 = vmovdqu64_avx512vl(local_12b8);
              auVar58 = ZEXT3264(auVar37);
              auVar37 = vmovdqu64_avx512vl(local_12d8);
              auVar59 = ZEXT3264(auVar37);
              auVar24 = vmovdqa64_avx512vl(auVar24);
              auVar60 = ZEXT1664(auVar24);
              auVar24 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar61 = ZEXT1664(auVar24);
              auVar24 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar62 = ZEXT1664(auVar24);
              auVar23 = vxorps_avx512vl(auVar23,auVar23);
              auVar63 = ZEXT1664(auVar23);
              auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar64 = ZEXT1664(auVar23);
            }
            uVar12 = uVar12 ^ 1L << (uVar11 & 0x3f);
          } while (uVar12 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }